

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O3

bool __thiscall
spirv_cross::Compiler::is_hidden_variable(Compiler *this,SPIRVariable *var,bool include_builtins)

{
  CombinedImageSampler *pCVar1;
  size_t sVar2;
  bool bVar3;
  __node_base_ptr p_Var4;
  CombinedImageSampler *pCVar5;
  size_t sVar6;
  CombinedImageSampler *pCVar7;
  long lVar8;
  long lVar9;
  key_type local_1c;
  
  bVar3 = is_builtin_variable(this,var);
  if (bVar3 && !include_builtins) {
    return true;
  }
  if (var->remapped_variable != false) {
    return true;
  }
  pCVar1 = (this->combined_image_samplers).super_VectorView<spirv_cross::CombinedImageSampler>.ptr;
  sVar2 = (this->combined_image_samplers).super_VectorView<spirv_cross::CombinedImageSampler>.
          buffer_size;
  local_1c.id = (var->super_IVariant).self.id;
  lVar8 = (long)sVar2 >> 2;
  pCVar5 = pCVar1;
  sVar6 = sVar2;
  if (0 < lVar8) {
    pCVar5 = pCVar1 + lVar8 * 4;
    lVar9 = lVar8 + 1;
    pCVar7 = pCVar1 + 2;
    do {
      if (pCVar7[-2].combined_id.id == local_1c.id) {
        pCVar7 = pCVar7 + -2;
        goto LAB_002b70b3;
      }
      if (pCVar7[-1].combined_id.id == local_1c.id) {
        pCVar7 = pCVar7 + -1;
        goto LAB_002b70b3;
      }
      if ((pCVar7->combined_id).id == local_1c.id) goto LAB_002b70b3;
      if (pCVar7[1].combined_id.id == local_1c.id) {
        pCVar7 = pCVar7 + 1;
        goto LAB_002b70b3;
      }
      lVar9 = lVar9 + -1;
      pCVar7 = pCVar7 + 4;
    } while (1 < lVar9);
    sVar6 = ((long)(sVar2 * 0xc + lVar8 * -0x30) >> 2) * -0x5555555555555555;
  }
  if (sVar6 == 1) {
LAB_002b70ac:
    pCVar7 = pCVar5;
    if ((pCVar5->combined_id).id != local_1c.id) goto LAB_002b70bb;
  }
  else if (sVar6 == 2) {
LAB_002b708d:
    pCVar7 = pCVar5;
    if ((pCVar5->combined_id).id != local_1c.id) {
      pCVar5 = pCVar5 + 1;
      goto LAB_002b70ac;
    }
  }
  else {
    if (sVar6 != 3) goto LAB_002b70bb;
    pCVar7 = pCVar5;
    if ((pCVar5->combined_id).id != local_1c.id) {
      pCVar5 = pCVar5 + 1;
      goto LAB_002b708d;
    }
  }
LAB_002b70b3:
  if (pCVar7 != pCVar1 + sVar2) {
    return false;
  }
LAB_002b70bb:
  if (this->check_active_interface_variables != true) {
    return false;
  }
  if (StorageClassStorageBuffer < var->storage) {
    return false;
  }
  if ((0x160fU >> (var->storage & 0x1f) & 1) == 0) {
    return false;
  }
  p_Var4 = ::std::
           _Hashtable<spirv_cross::TypedID<(spirv_cross::Types)2>,_spirv_cross::TypedID<(spirv_cross::Types)2>,_std::allocator<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::__detail::_Identity,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
           ::_M_find_before_node
                     (&(this->active_interface_variables)._M_h,
                      (ulong)local_1c.id % (this->active_interface_variables)._M_h._M_bucket_count,
                      &local_1c,(ulong)local_1c.id);
  if (p_Var4 == (__node_base_ptr)0x0) {
    return true;
  }
  return p_Var4->_M_nxt == (_Hash_node_base *)0x0;
}

Assistant:

bool Compiler::is_hidden_variable(const SPIRVariable &var, bool include_builtins) const
{
	if ((is_builtin_variable(var) && !include_builtins) || var.remapped_variable)
		return true;

	// Combined image samplers are always considered active as they are "magic" variables.
	if (find_if(begin(combined_image_samplers), end(combined_image_samplers), [&var](const CombinedImageSampler &samp) {
		    return samp.combined_id == var.self;
	    }) != end(combined_image_samplers))
	{
		return false;
	}

	bool hidden = false;
	if (check_active_interface_variables && storage_class_is_interface(var.storage))
		hidden = active_interface_variables.find(var.self) == end(active_interface_variables);
	return hidden;
}